

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chull.cpp
# Opt level: O0

void masc::polygon::updateHullTop
               (ply_vertex *v,
               list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *hull
               )

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference pppVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _List_iterator<masc::polygon::ply_vertex_*> local_30;
  VIT l2;
  _List_iterator<masc::polygon::ply_vertex_*> local_20;
  VIT l1;
  list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *hull_local;
  ply_vertex *v_local;
  
  l1._M_node = (_List_node_base *)hull;
  sVar5 = std::__cxx11::
          list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::size
                    (hull);
  if (sVar5 != 1) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::end
                   (l1._M_node);
    l2._M_node = (_List_node_base *)
                 std::_List_iterator<masc::polygon::ply_vertex_*>::operator--(&local_20,0);
    local_30._M_node = local_20._M_node;
    std::_List_iterator<masc::polygon::ply_vertex_*>::operator--(&local_30,0);
    pppVar6 = std::_List_iterator<masc::polygon::ply_vertex_*>::operator*(&local_30);
    iVar2 = (*(*pppVar6)->_vptr_ply_vertex[2])();
    pppVar6 = std::_List_iterator<masc::polygon::ply_vertex_*>::operator*(&local_20);
    iVar3 = (*(*pppVar6)->_vptr_ply_vertex[2])();
    iVar4 = (*v->_vptr_ply_vertex[2])();
    bVar1 = turn_left((Point2d *)CONCAT44(extraout_var,iVar2),
                      (Point2d *)CONCAT44(extraout_var_00,iVar3),
                      (Point2d *)CONCAT44(extraout_var_01,iVar4));
    if (!bVar1) {
      std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
      ::pop_back((list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *)
                 l1._M_node);
      updateHullTop(v,(list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                       *)l1._M_node);
    }
  }
  return;
}

Assistant:

inline void updateHullTop(ply_vertex * v,list<ply_vertex*>& hull)
{
    typedef list<ply_vertex*>::iterator VIT;
    if( hull.size()==1 ) return;
    VIT l1=hull.end(); l1--;
    VIT l2=l1; l2--;
    if( turn_left((*l2)->getPos(),(*l1)->getPos(),v->getPos()) )
        return;
    hull.pop_back();
    updateHullTop(v,hull);
}